

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngwutil.c
# Opt level: O2

void png_write_pHYs(png_structrp png_ptr,png_uint_32 x_pixels_per_unit,png_uint_32 y_pixels_per_unit
                   ,int unit_type)

{
  png_byte buf [9];
  
  if (1 < unit_type) {
    png_warning(png_ptr,"Unrecognized unit type for pHYs chunk");
  }
  buf[0] = (png_byte)(x_pixels_per_unit >> 0x18);
  buf[1] = (png_byte)(x_pixels_per_unit >> 0x10);
  buf[2] = (png_byte)(x_pixels_per_unit >> 8);
  buf[3] = (png_byte)x_pixels_per_unit;
  buf[4] = (png_byte)(y_pixels_per_unit >> 0x18);
  buf[5] = (png_byte)(y_pixels_per_unit >> 0x10);
  buf[6] = (png_byte)(y_pixels_per_unit >> 8);
  buf[7] = (png_byte)y_pixels_per_unit;
  buf[8] = (png_byte)unit_type;
  png_write_complete_chunk(png_ptr,0x70485973,buf,9);
  return;
}

Assistant:

void /* PRIVATE */
png_write_pHYs(png_structrp png_ptr, png_uint_32 x_pixels_per_unit,
    png_uint_32 y_pixels_per_unit,
    int unit_type)
{
   png_byte buf[9];

   png_debug(1, "in png_write_pHYs");

   if (unit_type >= PNG_RESOLUTION_LAST)
      png_warning(png_ptr, "Unrecognized unit type for pHYs chunk");

   png_save_uint_32(buf, x_pixels_per_unit);
   png_save_uint_32(buf + 4, y_pixels_per_unit);
   buf[8] = (png_byte)unit_type;

   png_write_complete_chunk(png_ptr, png_pHYs, buf, 9);
}